

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

ssize_t __thiscall pbrt::BinaryReader::read(BinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  int iVar2;
  pointer puVar3;
  void *pvVar4;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  size_t __n;
  long *local_48 [2];
  long local_38 [2];
  
  uVar1 = this->currentEntityOffset + 4;
  puVar3 = (this->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3) < uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    iVar2 = *(int *)(puVar3 + this->currentEntityOffset);
    __n = (size_t)iVar2;
    this->currentEntityOffset = uVar1;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct((ulong)local_48,(char)iVar2);
    std::__cxx11::string::operator=
              ((string *)CONCAT44(in_register_00000034,__fd),(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    puVar3 = (this->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->currentEntityOffset + __n <=
        (ulong)((long)(this->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3)) {
      pvVar4 = memcpy(*(void **)CONCAT44(in_register_00000034,__fd),
                      puVar3 + this->currentEntityOffset,__n);
      this->currentEntityOffset = this->currentEntityOffset + __n;
      return (ssize_t)pvVar4;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read(std::string &t)
    {
      int32_t size;
      read(size);
      t = std::string(size,' ');
      copyBytes(t.data(),size);
    }